

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setModelColumn(QComboBox *this,int visibleColumn)

{
  QComboBoxPrivate *pQVar1;
  QComboBoxPrivateContainer *this_00;
  QListView *this_01;
  QCompleter *pQVar2;
  int in_ESI;
  QComboBox *in_RDI;
  QListView *unaff_retaddr;
  QListView *lv;
  QComboBoxPrivate *d;
  QComboBoxPrivate *in_stack_00000058;
  int column;
  undefined4 in_stack_fffffffffffffff0;
  
  pQVar1 = d_func((QComboBox *)0x53dccf);
  pQVar1->modelColumn = in_ESI;
  this_00 = QComboBoxPrivate::viewContainer(in_stack_00000058);
  QComboBoxPrivateContainer::itemView(this_00);
  this_01 = qobject_cast<QListView*>((QObject *)0x53dcfd);
  if (this_01 != (QListView *)0x0) {
    QListView::setModelColumn(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  if (pQVar1->lineEdit != (QLineEdit *)0x0) {
    pQVar2 = QLineEdit::completer((QLineEdit *)this_01);
    column = (int)((ulong)pQVar1 >> 0x20);
    if (pQVar2 != (QCompleter *)0x0) {
      QLineEdit::completer((QLineEdit *)this_01);
      QCompleter::setCompletionColumn
                ((QCompleter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),column);
    }
  }
  currentIndex((QComboBox *)this_01);
  setCurrentIndex(in_RDI,in_ESI);
  return;
}

Assistant:

void QComboBox::setModelColumn(int visibleColumn)
{
    Q_D(QComboBox);
    d->modelColumn = visibleColumn;
    QListView *lv = qobject_cast<QListView *>(d->viewContainer()->itemView());
    if (lv)
        lv->setModelColumn(visibleColumn);
#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setCompletionColumn(visibleColumn);
#endif
    setCurrentIndex(currentIndex()); //update the text to the text of the new column;
}